

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O0

void __thiscall
EnvironmentMap::create_descriptors(EnvironmentMap *this,shared_ptr<myvk::Device> *device)

{
  initializer_list<VkDescriptorPoolSize> __l;
  element_type *this_00;
  VkDescriptorSetLayoutBinding alias_table_image_binding;
  VkDescriptorSetLayoutBinding hdr_image_binding;
  VkSampler immutable_samplers [1];
  shared_ptr<myvk::DescriptorPool> *__r;
  shared_ptr<myvk::DescriptorPool> *in_stack_fffffffffffffe80;
  DescriptorBindingFlagGroup *this_01;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *in_stack_fffffffffffffe90;
  allocator_type *__a;
  undefined4 in_stack_fffffffffffffeb0;
  uint32_t in_stack_fffffffffffffeb4;
  Ptr<Device> *in_stack_fffffffffffffeb8;
  VkDescriptorBindingFlagBits in_stack_fffffffffffffec0;
  VkDescriptorBindingFlagBits in_stack_fffffffffffffec4;
  pointer in_stack_fffffffffffffed8;
  DescriptorBindingFlagGroup *in_stack_fffffffffffffee0;
  pair<VkDescriptorSetLayoutBinding,_unsigned_int> local_118;
  DescriptorBindingFlagGroup *local_f8;
  undefined8 local_f0;
  DescriptorBindingFlagGroup *in_stack_ffffffffffffff30;
  Ptr<DescriptorPool> *in_stack_ffffffffffffff38;
  VkDescriptorSetLayoutBinding local_a8;
  VkDescriptorSetLayoutBinding local_88;
  VkSampler local_70 [3];
  allocator_type local_51;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 *local_48;
  undefined8 local_40;
  shared_ptr<myvk::DescriptorPool> local_20 [2];
  
  local_50 = 1;
  local_4c = 2;
  local_48 = &local_50;
  local_40 = 1;
  __a = &local_51;
  std::allocator<VkDescriptorPoolSize>::allocator((allocator<VkDescriptorPoolSize> *)0x1685b5);
  __l._M_len._0_4_ = in_stack_fffffffffffffec0;
  __l._M_array = (iterator)in_stack_fffffffffffffeb8;
  __l._M_len._4_4_ = in_stack_fffffffffffffec4;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),__l,__a);
  myvk::DescriptorPool::Create
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)__a);
  __r = local_20;
  std::shared_ptr<myvk::DescriptorPool>::operator=(in_stack_fffffffffffffe80,__r);
  std::shared_ptr<myvk::DescriptorPool>::~shared_ptr((shared_ptr<myvk::DescriptorPool> *)0x16861d);
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~vector
            (in_stack_fffffffffffffe90);
  std::allocator<VkDescriptorPoolSize>::~allocator(&local_51);
  this_00 = std::__shared_ptr_access<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x168645);
  local_70[0] = myvk::Sampler::GetHandle(this_00);
  local_88.binding = 0;
  local_88.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  local_88.descriptorCount = 1;
  local_88.stageFlags = 0x30;
  local_a8.pImmutableSamplers = local_70;
  local_a8.binding = 1;
  local_a8.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  local_a8.descriptorCount = 1;
  local_a8.stageFlags = 0x20;
  this_01 = (DescriptorBindingFlagGroup *)&stack0xfffffffffffffec8;
  local_88.pImmutableSamplers = local_a8.pImmutableSamplers;
  std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>::
  pair<VkDescriptorSetLayoutBinding_&,_VkDescriptorBindingFlagBits,_true>
            ((pair<VkDescriptorSetLayoutBinding,_unsigned_int> *)this_01,&local_88,
             (VkDescriptorBindingFlagBits *)&stack0xfffffffffffffec4);
  std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>::
  pair<VkDescriptorSetLayoutBinding_&,_VkDescriptorBindingFlagBits,_true>
            (&local_118,&local_a8,(VkDescriptorBindingFlagBits *)&stack0xfffffffffffffec0);
  local_f0 = 2;
  local_f8 = this_01;
  myvk::DescriptorBindingFlagGroup::DescriptorBindingFlagGroup
            (in_stack_fffffffffffffee0,
             (initializer_list<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_> *)
             in_stack_fffffffffffffed8);
  myvk::DescriptorSetLayout::Create
            ((Ptr<Device> *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::shared_ptr<myvk::DescriptorSetLayout>::operator=
            ((shared_ptr<myvk::DescriptorSetLayout> *)this_01,
             (shared_ptr<myvk::DescriptorSetLayout> *)__r);
  std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
            ((shared_ptr<myvk::DescriptorSetLayout> *)0x1687af);
  myvk::DescriptorBindingFlagGroup::~DescriptorBindingFlagGroup(this_01);
  myvk::DescriptorSet::Create
            (in_stack_ffffffffffffff38,(Ptr<DescriptorSetLayout> *)in_stack_ffffffffffffff30);
  std::shared_ptr<myvk::DescriptorSet>::operator=
            ((shared_ptr<myvk::DescriptorSet> *)this_01,(shared_ptr<myvk::DescriptorSet> *)__r);
  std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x1687f3);
  return;
}

Assistant:

void EnvironmentMap::create_descriptors(const std::shared_ptr<myvk::Device> &device) {
	m_descriptor_pool = myvk::DescriptorPool::Create(device, 1, {{VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 2}});
	{
		VkSampler immutable_samplers[] = {m_sampler->GetHandle()};

		VkDescriptorSetLayoutBinding hdr_image_binding = {};
		hdr_image_binding.binding = 0;
		hdr_image_binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		hdr_image_binding.descriptorCount = 1;
		hdr_image_binding.stageFlags = VK_SHADER_STAGE_FRAGMENT_BIT | VK_SHADER_STAGE_COMPUTE_BIT;
		hdr_image_binding.pImmutableSamplers = immutable_samplers;

		VkDescriptorSetLayoutBinding alias_table_image_binding = {};
		alias_table_image_binding.binding = 1;
		alias_table_image_binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		alias_table_image_binding.descriptorCount = 1;
		alias_table_image_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;
		alias_table_image_binding.pImmutableSamplers = immutable_samplers;

		m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(
		    device, {{hdr_image_binding, VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT},
		             {alias_table_image_binding, VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT}});
	}
	m_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_descriptor_set_layout);
}